

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hiredis.c
# Opt level: O2

uint32_t countDigits(uint64_t v)

{
  uint32_t uVar1;
  
  uVar1 = 4;
  while( true ) {
    if (v < 10) {
      return uVar1 - 3;
    }
    if (v < 100) {
      return uVar1 - 2;
    }
    if (v < 1000) {
      return uVar1 - 1;
    }
    if (v < 10000) break;
    v = v / 10000;
    uVar1 = uVar1 + 4;
  }
  return uVar1;
}

Assistant:

static uint32_t countDigits(uint64_t v) {
  uint32_t result = 1;
  for (;;) {
    if (v < 10) return result;
    if (v < 100) return result + 1;
    if (v < 1000) return result + 2;
    if (v < 10000) return result + 3;
    v /= 10000U;
    result += 4;
  }
}